

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTime.c
# Opt level: O3

float Tim_ManGetCoRequired(Tim_Man_t *p,int iCo)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Tim_Obj_t *pTVar4;
  uint *puVar5;
  Tim_Obj_t *pTVar6;
  float *pfVar7;
  float *pfVar8;
  uint uVar9;
  float *pfVar10;
  ulong uVar11;
  ulong uVar12;
  float *pfVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  
  if (p->nCos <= iCo) {
    __assert_fail("i < p->nCos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timInt.h"
                  ,0x5e,"Tim_Obj_t *Tim_ManCo(Tim_Man_t *, int)");
  }
  pTVar4 = p->pCos;
  iVar1 = p->fUseTravId;
  if (iVar1 == 0) {
    uVar9 = p->nTravIds;
  }
  else {
    uVar9 = p->nTravIds;
    if (pTVar4[iCo].TravId == uVar9) goto LAB_004a31a1;
  }
  pTVar4[iCo].TravId = uVar9;
  iVar2 = pTVar4[iCo].iObj2Box;
  if (-1 < (long)iVar2) {
    if (p->vBoxes->nSize <= iVar2) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    puVar5 = (uint *)p->vBoxes->pArray[iVar2];
    if (puVar5 != (uint *)0x0) {
      puVar5[1] = uVar9;
      if ((iVar1 != 0) && (uVar9 = puVar5[3], 0 < (int)uVar9)) {
        uVar14 = 0;
        do {
          if (p->pCis == (Tim_Obj_t *)0x0) break;
          if (p->pCis[(int)puVar5[(long)(int)puVar5[2] + uVar14 + 7]].TravId != p->nTravIds) {
            printf("Tim_ManGetCoRequired(): Output required times of output %d the box %d are not up to date!\n"
                   ,uVar14 & 0xffffffff,(ulong)*puVar5);
            uVar9 = puVar5[3];
          }
          uVar14 = uVar14 + 1;
        } while ((int)uVar14 < (int)uVar9);
      }
      pfVar7 = Tim_ManBoxDelayTable(p,*puVar5);
      uVar14 = (ulong)puVar5[2];
      if ((0 < (int)puVar5[2]) && (pTVar6 = p->pCos, pTVar6 != (Tim_Obj_t *)0x0)) {
        uVar9 = puVar5[3];
        iVar1 = p->nTravIds;
        uVar11 = 0;
        pfVar13 = pfVar7 + 3;
        do {
          fVar15 = 1e+09;
          if (0 < (int)uVar9) {
            uVar12 = 0;
            fVar15 = 1e+09;
            pfVar8 = pfVar7 + 3;
            pfVar10 = pfVar13;
            do {
              if (p->pCis == (Tim_Obj_t *)0x0) {
                fVar15 = 1e+09;
                break;
              }
              if (((*pfVar8 != -1e+09) || (NAN(*pfVar8))) &&
                 (fVar16 = p->pCis[(int)puVar5[uVar14 + uVar12 + 7]].timeReq - *pfVar10,
                 fVar16 <= fVar15)) {
                fVar15 = fVar16;
              }
              uVar12 = uVar12 + 1;
              pfVar8 = pfVar8 + uVar14 + 1;
              pfVar10 = pfVar10 + uVar14;
            } while (uVar9 != uVar12);
          }
          uVar3 = puVar5[uVar11 + 7];
          pTVar6[(int)uVar3].timeReq = fVar15;
          pTVar6[(int)uVar3].TravId = iVar1;
          uVar11 = uVar11 + 1;
          pfVar13 = pfVar13 + 1;
        } while (uVar11 != uVar14);
      }
    }
  }
LAB_004a31a1:
  return pTVar4[iCo].timeReq;
}

Assistant:

float Tim_ManGetCoRequired( Tim_Man_t * p, int iCo )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObjThis, * pObj, * pObjRes;
    float * pTable, * pDelays, DelayBest;
    int i, k;
    // consider the already processed PO
    pObjThis = Tim_ManCo( p, iCo );
    if ( p->fUseTravId && pObjThis->TravId == p->nTravIds )
        return pObjThis->timeReq;
    pObjThis->TravId = p->nTravIds;
    // consider the main PO
    pBox = Tim_ManCoBox( p, iCo );
    if ( pBox == NULL )
        return pObjThis->timeReq;
    // update box timing
    pBox->TravId = p->nTravIds;
    // get the required times of the outputs of the box (PIs)
    if ( p->fUseTravId )
    Tim_ManBoxForEachOutput( p, pBox, pObj, i )
        if ( pObj->TravId != p->nTravIds )
            printf( "Tim_ManGetCoRequired(): Output required times of output %d the box %d are not up to date!\n", i, pBox->iBox );
    // compute the required times for each input of the box (POs)
    pTable = Tim_ManBoxDelayTable( p, pBox->iBox );
    Tim_ManBoxForEachInput( p, pBox, pObjRes, i )
    {
        DelayBest = TIM_ETERNITY;
        Tim_ManBoxForEachOutput( p, pBox, pObj, k )
        {
            pDelays = pTable + 3 + k * pBox->nInputs;
            if ( pDelays[k] != -ABC_INFINITY )
                DelayBest = Abc_MinFloat( DelayBest, pObj->timeReq - pDelays[i] );
        }
        pObjRes->timeReq = DelayBest;
        pObjRes->TravId = p->nTravIds;
    }
    return pObjThis->timeReq;
}